

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSat.c
# Opt level: O2

int Dch_NodesAreEquiv(Dch_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  Dch_Pars_t *pDVar1;
  sat_solver *s;
  uint __line;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  long lVar6;
  int iVar7;
  char *__assertion;
  undefined8 local_40;
  long local_38;
  
  pDVar1 = p->pPars;
  iVar3 = pDVar1->nBTLimit;
  p->nSatCalls = p->nSatCalls + 1;
  if (((ulong)pNew & 1) != 0) {
    __assertion = "!Aig_IsComplement(pNew)";
    __line = 0x35;
LAB_004e994b:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                  ,__line,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pOld & 1) != 0) {
    __assertion = "!Aig_IsComplement(pOld)";
    __line = 0x36;
    goto LAB_004e994b;
  }
  if (pNew == pOld) {
    __assertion = "pNew != pOld";
    __line = 0x37;
    goto LAB_004e994b;
  }
  iVar2 = p->nCallsSince;
  p->nCallsSince = iVar2 + 1;
  if ((p->pSat == (sat_solver *)0x0) ||
     (((pDVar1->nSatVarMax != 0 && (pDVar1->nSatVarMax < p->nSatVars)) &&
      (pDVar1->nCallsRecycle <= iVar2)))) {
    Dch_ManSatSolverRecycle(p);
  }
  Dch_CnfNodeAddToSolver(p,pOld);
  Dch_CnfNodeAddToSolver(p,pNew);
  s = p->pSat;
  if (s->qtail != s->qhead) {
    iVar2 = sat_solver_simplify(s);
    if (iVar2 == 0) {
      __assertion = "status != 0";
      __line = 0x4a;
      goto LAB_004e994b;
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assertion = "p->pSat->qtail == p->pSat->qhead";
      __line = 0x4b;
      goto LAB_004e994b;
    }
  }
  iVar2 = p->pSatVars[pOld->Id] * 2;
  iVar7 = (uint)((((uint)*(ulong *)&pNew->field_0x18 ^ (uint)*(ulong *)&pOld->field_0x18) & 8) == 0)
          + p->pSatVars[pNew->Id] * 2;
  local_40 = CONCAT44(iVar7,iVar2);
  if (p->pPars->fPolarFlip != 0) {
    if ((*(ulong *)&pOld->field_0x18 & 8) != 0) {
      local_40 = CONCAT44(iVar7,iVar2) | 1;
    }
    if ((*(ulong *)&pNew->field_0x18 & 8) != 0) {
      local_40 = CONCAT44(iVar7,(lit)local_40) ^ 0x100000000;
    }
  }
  aVar4 = Abc_Clock();
  local_38 = (long)iVar3;
  iVar3 = sat_solver_solve(p->pSat,(lit *)&local_40,(lit *)&local_38,(long)iVar3,0,0,0);
  aVar5 = Abc_Clock();
  p->timeSat = p->timeSat + (aVar5 - aVar4);
  aVar5 = Abc_Clock();
  lVar6 = aVar5 - aVar4;
  if (iVar3 == 1) {
LAB_004e988a:
    iVar3 = 0;
    p->timeSatSat = p->timeSatSat + lVar6;
    p->nSatCallsSat = p->nSatCallsSat + 1;
  }
  else {
    if (iVar3 != -1) {
LAB_004e9899:
      p->timeSatUndec = p->timeSatUndec + lVar6;
      p->nSatFailsReal = p->nSatFailsReal + 1;
      return -1;
    }
    p->timeSatUnsat = p->timeSatUnsat + lVar6;
    local_40 = local_40 ^ 0x100000001;
    iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
    if (iVar3 == 0) {
      __assertion = "RetValue";
      __line = 0x62;
      goto LAB_004e994b;
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    if (p->pAigFraig->pConst1 != pOld) {
      iVar2 = p->pSatVars[pOld->Id];
      iVar3 = (((uint)*(ulong *)&pNew->field_0x18 ^ (uint)*(ulong *)&pOld->field_0x18) >> 3 & 1) +
              p->pSatVars[pNew->Id] * 2;
      local_40 = CONCAT44(iVar3,iVar2 * 2 + 1);
      if (p->pPars->fPolarFlip != 0) {
        if ((*(ulong *)&pOld->field_0x18 & 8) != 0) {
          local_40 = CONCAT44(iVar3,iVar2 * 2);
        }
        if ((*(ulong *)&pNew->field_0x18 & 8) != 0) {
          local_40 = CONCAT44(iVar3,(lit)local_40) ^ 0x100000000;
        }
      }
      aVar4 = Abc_Clock();
      iVar3 = sat_solver_solve(p->pSat,(lit *)&local_40,(lit *)&local_38,local_38,0,0,0);
      aVar5 = Abc_Clock();
      p->timeSat = p->timeSat + (aVar5 - aVar4);
      aVar5 = Abc_Clock();
      lVar6 = aVar5 - aVar4;
      if (iVar3 == 1) goto LAB_004e988a;
      if (iVar3 != -1) goto LAB_004e9899;
      p->timeSatUnsat = p->timeSatUnsat + lVar6;
      local_40 = local_40 ^ 0x100000001;
      iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                      ,0x8c,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    }
    p->nSatProof = p->nSatProof + 1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Runs equivalence test for the two nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dch_NodesAreEquiv( Dch_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{
    int nBTLimit = p->pPars->nBTLimit;
    int pLits[2], RetValue, RetValue1, status;
    abctime clk;
    p->nSatCalls++;

    // sanity checks
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    p->nCallsSince++;  // experiment with this!!!
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Dch_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
    Dch_CnfNodeAddToSolver( p, pOld );
    Dch_CnfNodeAddToSolver( p, pNew );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    pLits[0] = toLitCond( Dch_ObjSatNum(p,pOld), 0 );
    pLits[1] = toLitCond( Dch_ObjSatNum(p,pNew), pOld->fPhase == pNew->fPhase );
    if ( p->pPars->fPolarFlip )
    {
        if ( pOld->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( pNew->fPhase )  pLits[1] = lit_neg( pLits[1] );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatFailsReal++;
        return -1;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == Aig_ManConst1(p->pAigFraig) )
    {
        p->nSatProof++;
        return 1;
    }

    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
    pLits[0] = toLitCond( Dch_ObjSatNum(p,pOld), 1 );
    pLits[1] = toLitCond( Dch_ObjSatNum(p,pNew), pOld->fPhase ^ pNew->fPhase );
    if ( p->pPars->fPolarFlip )
    {
        if ( pOld->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( pNew->fPhase )  pLits[1] = lit_neg( pLits[1] );
    }
clk = Abc_Clock();
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatFailsReal++;
        return -1;
    }
    // return SAT proof
    p->nSatProof++;
    return 1;
}